

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void Load16x4_SSE2(uint8_t *r0,uint8_t *r8,int stride,__m128i *p1,__m128i *p0,__m128i *q0,
                  __m128i *q1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *in_RCX;
  undefined8 *in_R8;
  undefined8 *in_R9;
  __m128i t2;
  __m128i t1;
  undefined4 local_88;
  undefined4 uStackY_84;
  undefined4 local_78;
  undefined4 uStackY_74;
  undefined4 local_68;
  undefined4 uStackY_64;
  __m128i *in_stack_ffffffffffffffa0;
  __m128i *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  int stride_00;
  uint8_t *in_stack_ffffffffffffffb8;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  stride_00 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  Load8x4_SSE2(in_stack_ffffffffffffffb8,stride_00,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0);
  Load8x4_SSE2(in_stack_ffffffffffffffb8,stride_00,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0);
  uVar1 = *in_RCX;
  uVar2 = in_RCX[1];
  uVar3 = *in_R9;
  uVar4 = in_R9[1];
  local_68 = (undefined4)*in_R8;
  uStackY_64 = (undefined4)((ulong)*in_R8 >> 0x20);
  *(int *)in_RCX = (int)uVar1;
  *(int *)((long)in_RCX + 4) = (int)((ulong)uVar1 >> 0x20);
  *(undefined4 *)(in_RCX + 1) = local_68;
  *(undefined4 *)((long)in_RCX + 0xc) = uStackY_64;
  uStack_10 = (undefined4)uVar2;
  uStack_c = (undefined4)((ulong)uVar2 >> 0x20);
  uStack_20 = (undefined4)in_R8[1];
  uStack_1c = (undefined4)((ulong)in_R8[1] >> 0x20);
  *(undefined4 *)in_R8 = uStack_10;
  *(undefined4 *)((long)in_R8 + 4) = uStack_c;
  *(undefined4 *)(in_R8 + 1) = uStack_20;
  *(undefined4 *)((long)in_R8 + 0xc) = uStack_1c;
  local_78 = (undefined4)uVar3;
  uStackY_74 = (undefined4)((ulong)uVar3 >> 0x20);
  local_88 = (undefined4)*(undefined8 *)t2[1];
  uStackY_84 = (undefined4)((ulong)*(undefined8 *)t2[1] >> 0x20);
  *(undefined4 *)in_R9 = local_78;
  *(undefined4 *)((long)in_R9 + 4) = uStackY_74;
  *(undefined4 *)(in_R9 + 1) = local_88;
  *(undefined4 *)((long)in_R9 + 0xc) = uStackY_84;
  uStack_30 = (undefined4)uVar4;
  uStack_2c = (undefined4)((ulong)uVar4 >> 0x20);
  uStack_40 = (undefined4)*(undefined8 *)(t2[1] + 8);
  uStack_3c = (undefined4)((ulong)*(undefined8 *)(t2[1] + 8) >> 0x20);
  *(undefined4 *)t2[1] = uStack_30;
  *(undefined4 *)(t2[1] + 4) = uStack_2c;
  *(undefined4 *)(t2[1] + 8) = uStack_40;
  *(undefined4 *)(t2[1] + 0xc) = uStack_3c;
  return;
}

Assistant:

static WEBP_INLINE void Load16x4_SSE2(const uint8_t* const r0,
                                      const uint8_t* const r8,
                                      int stride,
                                      __m128i* const p1, __m128i* const p0,
                                      __m128i* const q0, __m128i* const q1) {
  // Assume the pixels around the edge (|) are numbered as follows
  //                00 01 | 02 03
  //                10 11 | 12 13
  //                 ...  |  ...
  //                e0 e1 | e2 e3
  //                f0 f1 | f2 f3
  //
  // r0 is pointing to the 0th row (00)
  // r8 is pointing to the 8th row (80)

  // Load
  // p1 = 71 61 51 41 31 21 11 01 70 60 50 40 30 20 10 00
  // q0 = 73 63 53 43 33 23 13 03 72 62 52 42 32 22 12 02
  // p0 = f1 e1 d1 c1 b1 a1 91 81 f0 e0 d0 c0 b0 a0 90 80
  // q1 = f3 e3 d3 c3 b3 a3 93 83 f2 e2 d2 c2 b2 a2 92 82
  Load8x4_SSE2(r0, stride, p1, q0);
  Load8x4_SSE2(r8, stride, p0, q1);

  {
    // p1 = f0 e0 d0 c0 b0 a0 90 80 70 60 50 40 30 20 10 00
    // p0 = f1 e1 d1 c1 b1 a1 91 81 71 61 51 41 31 21 11 01
    // q0 = f2 e2 d2 c2 b2 a2 92 82 72 62 52 42 32 22 12 02
    // q1 = f3 e3 d3 c3 b3 a3 93 83 73 63 53 43 33 23 13 03
    const __m128i t1 = *p1;
    const __m128i t2 = *q0;
    *p1 = _mm_unpacklo_epi64(t1, *p0);
    *p0 = _mm_unpackhi_epi64(t1, *p0);
    *q0 = _mm_unpacklo_epi64(t2, *q1);
    *q1 = _mm_unpackhi_epi64(t2, *q1);
  }
}